

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

uint32_t icu_63::GreekUpper::getDiacriticData(UChar32 c)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = 0x4000;
  uVar2 = c - 0x300;
  if (uVar2 < 0x15) {
    if ((0x2000fU >> (uVar2 & 0x1f) & 1) != 0) {
      return 0x4000;
    }
    if ((0x180050U >> (uVar2 & 0x1f) & 1) != 0) {
      return 0x20000;
    }
    if (uVar2 == 8) {
      return 0x10000;
    }
  }
  switch(c) {
  case 0x342:
    break;
  case 0x343:
    return 0x20000;
  case 0x344:
    return 0x14000;
  case 0x345:
    return 0x2000;
  default:
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t getDiacriticData(UChar32 c) {
    switch (c) {
    case 0x0300:  // varia
    case 0x0301:  // tonos = oxia
    case 0x0342:  // perispomeni
    case 0x0302:  // circumflex can look like perispomeni
    case 0x0303:  // tilde can look like perispomeni
    case 0x0311:  // inverted breve can look like perispomeni
        return HAS_ACCENT;
    case 0x0308:  // dialytika = diaeresis
        return HAS_COMBINING_DIALYTIKA;
    case 0x0344:  // dialytika tonos
        return HAS_COMBINING_DIALYTIKA | HAS_ACCENT;
    case 0x0345:  // ypogegrammeni = iota subscript
        return HAS_YPOGEGRAMMENI;
    case 0x0304:  // macron
    case 0x0306:  // breve
    case 0x0313:  // comma above
    case 0x0314:  // reversed comma above
    case 0x0343:  // koronis
        return HAS_OTHER_GREEK_DIACRITIC;
    default:
        return 0;
    }
}